

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask2_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  
  auVar4 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_0019d0a0);
  auVar3 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 9),_DAT_001a0360);
  auVar1 = vpor_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpor_avx(auVar3,auVar2);
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar2 = vpor_avx(auVar2,auVar3);
  *out = auVar2._0_4_ | in[0xd] << 0x1a | in[0xf] << 0x1e | in[0xe] << 0x1c | auVar1._0_4_ | *in;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask2_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 26;
  ++in;
  *out |= ((*in)) << 28;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  ++in;

  return out;
}